

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall resetOnEndTimeFixture::createSession(resetOnEndTimeFixture *this)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  sessionFixture *psVar4;
  sessionFixture *psVar5;
  ulong uVar6;
  long lVar7;
  int local_20;
  int64_t local_18;
  
  FIX::DateTime::nowUtc();
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.m_date =
       local_20;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.m_time =
       local_18;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_date =
       (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
       m_date;
  *(undefined4 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
    super_DateTime.field_0xc =
       *(undefined4 *)
        &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
         field_0xc;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time =
       (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
       m_time;
  auVar3 = SEXT816((this->super_acceptorFixture).super_sessionFixture.super_TestCallback.
                   startTimeStamp.super_DateTime.m_time) * SEXT816(0x112e0be826d694b3);
  lVar7 = (long)((int)(auVar3._8_8_ >> 0x1a) - (auVar3._12_4_ >> 0x1f));
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = ((lVar7 / 0xe10) * -0xe10 + (lVar7 / 0xe10) * 0xe10 + lVar7) * 1000000000;
  psVar4 = &(this->super_acceptorFixture).super_sessionFixture;
  uVar1 = *(undefined4 *)&(psVar4->super_TestCallback).startTimeStamp.super_DateTime.field_0xc;
  psVar5 = &(this->super_acceptorFixture).super_sessionFixture;
  (psVar5->super_TestCallback).endTimeStamp.super_DateTime.m_date =
       (psVar4->super_TestCallback).startTimeStamp.super_DateTime.m_date;
  *(undefined4 *)&(psVar5->super_TestCallback).endTimeStamp.super_DateTime.field_0xc = uVar1;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime.
  m_time = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
           super_DateTime.m_time;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  uVar2 = *(undefined8 *)
           &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
            super_DateTime.field_0xc;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = uVar2;
  uVar1 = *(undefined4 *)
           ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.
                   startTimeStamp.super_DateTime.m_time + 4);
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) = uVar1;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = uVar2;
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) = uVar1;
  lVar7 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
          super_DateTime.m_time;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = lVar7 + 2000000000U;
  if (lVar7 < 0x4e941a196c00) {
    if (-0x77359401 < lVar7) goto LAB_00284a9d;
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_date = -1;
    uVar6 = lVar7 + 0x4e9508849400;
  }
  else {
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_date = 1;
    uVar6 = (lVar7 + 2000000000U) % 86400000000000;
  }
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = uVar6;
LAB_00284a9d:
  anon_unknown.dwarf_5319c9::sessionFixture::createSession((sessionFixture *)this,0,-1,-1);
  return;
}

Assistant:

void createSession() {
    now.setCurrent();
    startTimeStamp = now;
    startTimeStamp.setMillisecond(0);

    endTimeStamp = startTimeStamp;

    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);
    endTime += 2;

    acceptorFixture::createSession(0);
  }